

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanf.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  size_t sVar4;
  int actual_rc_34;
  int actual_rc_33;
  int actual_rc_32;
  int actual_rc_31;
  int actual_rc_30;
  int actual_rc_29;
  int actual_rc_28;
  int actual_rc_27;
  int actual_rc_26;
  int actual_rc_25;
  int actual_rc_24;
  int actual_rc_23;
  int actual_rc_22;
  int actual_rc_21;
  int actual_rc_20;
  int actual_rc_19;
  int actual_rc_18;
  int actual_rc_17;
  int actual_rc_16;
  int actual_rc_15;
  int actual_rc_14;
  int actual_rc_13;
  int actual_rc_12;
  int actual_rc_11;
  int actual_rc_10;
  int actual_rc_9;
  int actual_rc_8;
  int actual_rc_7;
  int actual_rc_6;
  int actual_rc_5;
  int actual_rc_4;
  int actual_rc_3;
  int actual_rc_2;
  int actual_rc_1;
  int actual_rc;
  int n;
  int *p;
  uint u;
  int i;
  char buffer [100];
  FILE *source;
  
  pFVar3 = freopen("test_support/testfile","wb+",(FILE *)stdin);
  if (pFVar3 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/scanf.c, line %d - %s\n"
           ,0x23,"( source = freopen( testfile, \"wb+\", stdin ) ) != NULL");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo",1,3,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%3c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0xb,1,(ulong)uVar1);
  }
  iVar2 = memcmp(&u,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0xc,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("%x",1,2,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%%%c%n",&u,&actual_rc_1);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0xf,1,(ulong)uVar1);
  }
  if (actual_rc_1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x10,"n == 2");
  }
  if ((char)u != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x11,"buffer[0] == \'x\'");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("abcdefg",1,7,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%*[cba]%n",&actual_rc_1);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x13,0,(ulong)uVar1);
  }
  if (actual_rc_1 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x14,"n == 3");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo",1,3,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%*s%n",&actual_rc_1);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x15,0,(ulong)uVar1);
  }
  if (actual_rc_1 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x16,"n == 3");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("abc",1,3,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%*c%n",&actual_rc_1);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x17,0,(ulong)uVar1);
  }
  if (actual_rc_1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x18,"n == 1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("3xfoo",1,5,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%*dx%3c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x19,1,(ulong)uVar1);
  }
  iVar2 = memcmp(&u,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-2147483648",1,0xb,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x1d,1,(ulong)uVar1);
  }
  if (p._4_4_ != -0x80000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1e,"i == INT_MIN");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("2147483647",1,10,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x1f,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x20,"i == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-1",1,2,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x21,1,(ulong)uVar1);
  }
  if (p._4_4_ != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x22,"i == -1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x23,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x24,"i == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("1",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x25,1,(ulong)uVar1);
  }
  if (p._4_4_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x26,"i == 1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-2147483648",1,0xb,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x27,1,(ulong)uVar1);
  }
  if (p._4_4_ != -0x80000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x28,"i == INT_MIN");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("2147483647",1,10,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x29,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2a,"i == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-1",1,2,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2b,1,(ulong)uVar1);
  }
  if (p._4_4_ != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2c,"i == -1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2d,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2e,"i == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("1",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2f,1,(ulong)uVar1);
  }
  if (p._4_4_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x30,"i == 1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0x7FFFFFFF",1,10,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x31,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x32,"i == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0x0",1,3,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x33,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x34,"i == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("00",1,2,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%i%n",(long)&p + 4,&actual_rc_1);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x36,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x37,"i == 0");
  }
  if (actual_rc_1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x38,"n == 2");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("4294967295",1,10,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%u",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3b,1,(ulong)uVar1);
  }
  if ((int)p != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3c,"u == UINT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%u",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3d,1,(ulong)uVar1);
  }
  if ((int)p != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3e,"u == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("fFFFFFFF",1,8,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%x",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3f,1,(ulong)uVar1);
  }
  if ((int)p != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x40,"u == UINT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("7FFFFFFF",1,8,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%x",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x41,1,(ulong)uVar1);
  }
  if ((int)p != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x42,"u == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%o",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x43,1,(ulong)uVar1);
  }
  if ((int)p != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x44,"u == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("37777777777",1,0xb,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%o");
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x45,1,(ulong)uVar1);
  }
  if ((int)p != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x46,"u == UINT_MAX");
  }
  memset(&u,0,100);
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("x",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%c");
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x49,1,(ulong)uVar1);
  }
  if (CONCAT11(u._1_1_,(char)u) != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4a,"memcmp( buffer, \"x\\0\", 2 ) == 0");
  }
  memset(&u,0,100);
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo bar",1,7,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%s%n",&u,&actual_rc_1);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x4e,1,(ulong)uVar1);
  }
  if (CONCAT22(u._2_2_,CONCAT11(u._1_1_,(char)u)) != 0x6f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4f,"memcmp( buffer, \"foo\\0\", 4 ) == 0");
  }
  if (actual_rc_1 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x50,"n == 3");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo bar  baz",1,0xc,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%s %s %n",&u,&i,&actual_rc_1);
  if (uVar1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x51,2,(ulong)uVar1);
  }
  if (actual_rc_1 != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x52,"n == 9");
  }
  if (CONCAT44(i,CONCAT22(u._2_2_,CONCAT11(u._1_1_,(char)u))) != 0x726162006f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x53,"memcmp( buffer, \"foo\\0bar\\0\", 8 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("abcdefg",1,7,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%[cba]",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x56,1,(ulong)uVar1);
  }
  if (CONCAT22(u._2_2_,CONCAT11(u._1_1_,(char)u)) != 0x636261) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x57,"memcmp( buffer, \"abc\\0\", 4 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("",1,0,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%[cba]",&u);
  if (uVar1 != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x59,0xffffffff,(ulong)uVar1);
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("3",1,1,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%u%[cba]",&p,&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x5a,1,(ulong)uVar1);
  }
  _actual_rc = 0;
  sprintf((char *)&u,"%p",0);
  _actual_rc = (long)&p + 4;
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  sVar4 = strlen((char *)&u);
  fwrite(&u,1,sVar4,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%p",&actual_rc);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x60,1,(ulong)uVar1);
  }
  if (_actual_rc != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x61,"p == NULL");
  }
  _actual_rc = (long)&p + 4;
  sprintf((char *)&u,"%p",_actual_rc);
  _actual_rc = 0;
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  sVar4 = strlen((char *)&u);
  fwrite(&u,1,sVar4,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%p",&actual_rc);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x65,1,(ulong)uVar1);
  }
  if (_actual_rc != (long)&p + 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x66,"p == &i");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("",1,0,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%d",(long)&p + 4);
  if (uVar1 != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x68,0xffffffff,(ulong)uVar1);
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo",1,3,pFVar3);
  rewind(pFVar3);
  uVar1 = scanf("%5c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/scanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x69,1,(ulong)uVar1);
  }
  iVar2 = memcmp(&u,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x6a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  iVar2 = fclose(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/scanf.c, line %d - %s\n"
           ,0x25,"fclose( source ) == 0");
  }
  iVar2 = remove("test_support/testfile");
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/scanf.c, line %d - %s\n"
           ,0x26,"remove( testfile ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * source;
    TESTCASE( ( source = freopen( testfile, "wb+", stdin ) ) != NULL );
#include "scanf_testcases.h"
    TESTCASE( fclose( source ) == 0 );
    TESTCASE( remove( testfile ) == 0 );
    return TEST_RESULTS;
}